

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

Node * __thiscall wasm::DataFlow::Graph::visitExpression(Graph *this,Expression *curr)

{
  Id IVar1;
  pointer ppNVar2;
  mapped_type *ppEVar3;
  Node *pNVar4;
  Fatal local_1a8;
  
  IVar1 = curr->_id;
  switch(IVar1) {
  case BlockId:
    pNVar4 = doVisitBlock(this,(Block *)curr);
    return pNVar4;
  case IfId:
    pNVar4 = doVisitIf(this,(If *)curr);
    return pNVar4;
  case LoopId:
    pNVar4 = doVisitLoop(this,(Loop *)curr);
    return pNVar4;
  case BreakId:
    pNVar4 = doVisitBreak(this,(Break *)curr);
    return pNVar4;
  case SwitchId:
    pNVar4 = doVisitSwitch(this,(Switch *)curr);
    return pNVar4;
  case LocalGetId:
    pNVar4 = doVisitLocalGet(this,(LocalGet *)curr);
    return pNVar4;
  case LocalSetId:
    pNVar4 = doVisitLocalSet(this,(LocalSet *)curr);
    return pNVar4;
  case ConstId:
    pNVar4 = doVisitConst(this,(Const *)curr);
    return pNVar4;
  case UnaryId:
    pNVar4 = doVisitUnary(this,(Unary *)curr);
    return pNVar4;
  case BinaryId:
    pNVar4 = doVisitBinary(this,(Binary *)curr);
    return pNVar4;
  case SelectId:
    pNVar4 = doVisitSelect(this,(Select *)curr);
    return pNVar4;
  case DropId:
    Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
              ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,
               *(Expression **)(curr + 1));
    ppEVar3 = std::__detail::
              _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->expressionParentMap,(key_type *)(curr + 1));
    *ppEVar3 = curr;
    break;
  case UnreachableId:
    ppNVar2 = (this->locals).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar2) {
      (this->locals).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppNVar2;
    }
    break;
  default:
    if ((IVar1 < 0x38) && ((0xd0000000000000U >> ((ulong)(uint)IVar1 & 0x3f) & 1) != 0)) {
      Fatal::Fatal(&local_1a8);
      Fatal::operator<<(&local_1a8,(char (*) [46])"DataFlow does not support EH instructions yet");
      Fatal::~Fatal(&local_1a8);
    }
  case CallId:
  case CallIndirectId:
  case GlobalGetId:
  case GlobalSetId:
  case LoadId:
  case StoreId:
  case ReturnId:
  case MemorySizeId:
  case MemoryGrowId:
  case NopId:
    pNVar4 = doVisitGeneric(this,curr);
    return pNVar4;
  }
  return &this->bad;
}

Assistant:

Node* visitExpression(Expression* curr) {
    // TODO Exception handling instruction support

    // Control flow and get/set etc. are special. Aside from them, we just need
    // to do something very generic.
    if (auto* block = curr->dynCast<Block>()) {
      return doVisitBlock(block);
    } else if (auto* iff = curr->dynCast<If>()) {
      return doVisitIf(iff);
    } else if (auto* loop = curr->dynCast<Loop>()) {
      return doVisitLoop(loop);
    } else if (auto* get = curr->dynCast<LocalGet>()) {
      return doVisitLocalGet(get);
    } else if (auto* set = curr->dynCast<LocalSet>()) {
      return doVisitLocalSet(set);
    } else if (auto* br = curr->dynCast<Break>()) {
      return doVisitBreak(br);
    } else if (auto* sw = curr->dynCast<Switch>()) {
      return doVisitSwitch(sw);
    } else if (auto* c = curr->dynCast<Const>()) {
      return doVisitConst(c);
    } else if (auto* unary = curr->dynCast<Unary>()) {
      return doVisitUnary(unary);
    } else if (auto* binary = curr->dynCast<Binary>()) {
      return doVisitBinary(binary);
    } else if (auto* select = curr->dynCast<Select>()) {
      return doVisitSelect(select);
    } else if (auto* unreachable = curr->dynCast<Unreachable>()) {
      return doVisitUnreachable(unreachable);
    } else if (auto* drop = curr->dynCast<Drop>()) {
      return doVisitDrop(drop);
    } else if (curr->is<Try>() || curr->is<Throw>() || curr->is<Rethrow>()) {
      Fatal() << "DataFlow does not support EH instructions yet";
    } else {
      return doVisitGeneric(curr);
    }
  }